

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::UnaryAggregateHeap<long,_duckdb::LessThan>::Insert
          (UnaryAggregateHeap<long,_duckdb::LessThan> *this,ArenaAllocator *allocator,long *value)

{
  HeapEntry<long> *pHVar1;
  _ValueType __value;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  pHVar1 = this->heap;
  uVar4 = this->size;
  if (uVar4 < this->capacity) {
    this->size = uVar4 + 1;
    lVar2 = *value;
    pHVar1[uVar4].value = lVar2;
    if ((long)(uVar4 + 1) < 2) goto LAB_007d0058;
    do {
      uVar3 = uVar4 - 1;
      uVar5 = uVar3 >> 1;
      if (lVar2 <= pHVar1[uVar5].value) goto LAB_007d0058;
      pHVar1[uVar4].value = pHVar1[uVar5].value;
      uVar4 = uVar5;
    } while (1 < uVar3);
  }
  else {
    lVar2 = *value;
    if (pHVar1->value <= lVar2) {
      return;
    }
    if (1 < (long)uVar4) {
      lVar2 = pHVar1[uVar4 - 1].value;
      pHVar1[uVar4 - 1].value = pHVar1->value;
      uVar4 = uVar4 * 8 - 8;
      lVar6 = (long)uVar4 >> 3;
      if (lVar6 < 3) {
        uVar3 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (pHVar1[uVar5 * 2 + 2].value < pHVar1[uVar5 * 2 + 1].value) {
            uVar3 = uVar5 * 2 + 1;
          }
          else {
            uVar3 = uVar5 * 2 + 2;
          }
          pHVar1[uVar5].value = pHVar1[uVar3].value;
          uVar5 = uVar3;
        } while ((long)uVar3 < (lVar6 - (lVar6 + -1 >> 0x3f)) + -1 >> 1);
      }
      if (((uVar4 & 8) == 0) && (uVar3 == lVar6 + -2 >> 1)) {
        pHVar1[uVar3].value = pHVar1[uVar3 * 2 + 1].value;
        uVar3 = uVar3 * 2 + 1;
      }
      if (0 < (long)uVar3) {
        do {
          uVar4 = uVar3 - 1;
          uVar5 = uVar4 >> 1;
          if (lVar2 <= pHVar1[uVar5].value) goto LAB_007d0011;
          pHVar1[uVar3].value = pHVar1[uVar5].value;
          uVar3 = uVar5;
        } while (1 < uVar4);
        uVar3 = 0;
      }
LAB_007d0011:
      pHVar1[uVar3].value = lVar2;
      uVar4 = this->size;
      lVar2 = *value;
    }
    pHVar1[uVar4 - 1].value = lVar2;
    lVar6 = (long)(uVar4 << 3) >> 3;
    uVar4 = lVar6 - 1;
    if (lVar6 < 2) goto LAB_007d0058;
    do {
      uVar3 = uVar4 - 1;
      uVar5 = uVar3 >> 1;
      if (lVar2 <= pHVar1[uVar5].value) goto LAB_007d0058;
      pHVar1[uVar4].value = pHVar1[uVar5].value;
      uVar4 = uVar5;
    } while (1 < uVar3);
  }
  uVar4 = 0;
LAB_007d0058:
  pHVar1[uVar4].value = lVar2;
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}